

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O2

NoSelfMove * __thiscall
bssl::anon_unknown_0::InplaceVectorTest_EraseIf_Test::TestBody::NoSelfMove::operator=
          (NoSelfMove *this,NoSelfMove *other)

{
  if (this != other) {
    std::__uniq_ptr_impl<int,_std::default_delete<int>_>::operator=
              ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)this,
               (__uniq_ptr_impl<int,_std::default_delete<int>_> *)other);
    return this;
  }
  abort();
}

Assistant:

NoSelfMove &operator=(NoSelfMove &&other) {
      BSSL_CHECK(this != &other);
      v_ = std::move(other.v_);
      return *this;
    }